

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O1

void __thiscall DBaseStatusBar::RefreshBackground(DBaseStatusBar *this)

{
  int iVar1;
  uint y1;
  int iVar2;
  FTextureID FVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  FTexture *pFVar7;
  float aspect;
  
  aspect = ActiveRatio((screen->super_DSimpleCanvas).super_DCanvas.Width,
                       (screen->super_DSimpleCanvas).super_DCanvas.Height,(float *)0x0);
  if ((aspect < 1.5) || (this->Scaled == false)) {
    uVar5 = *(uint *)&(this->super_DObject).field_0x24;
  }
  else {
    iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar2 = AspectMultiplier(aspect);
    uVar5 = ((0x30 - iVar2) * iVar1) / 0x60;
  }
  piVar4 = &this->ST_Y;
  if (uVar5 != *(uint *)&(this->super_DObject).field_0x24) {
    piVar4 = &ST_Y;
  }
  if ((int)uVar5 < 1) {
    piVar4 = &ST_Y;
  }
  y1 = *piVar4;
  if (this->CompleteBorder == false) {
    if ((int)y1 < (screen->super_DSimpleCanvas).super_DCanvas.Height) {
      V_DrawBorder(uVar5 + 1,y1,(screen->super_DSimpleCanvas).super_DCanvas.Width,y1 + 1);
      iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      V_DrawBorder(uVar5 + 1,iVar1 + -1,(screen->super_DSimpleCanvas).super_DCanvas.Width,iVar1);
    }
  }
  else {
    uVar5 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  }
  if (0 < (int)uVar5) {
    if (this->CompleteBorder == false) {
      if ((aspect < 1.5) || (this->Scaled == false)) {
        uVar6 = this->HorizontalResolution + *(int *)&(this->super_DObject).field_0x24;
      }
      else {
        iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        iVar2 = AspectMultiplier(aspect);
        iVar2 = (int)((ulong)((long)((0x30 - iVar2) * iVar1 + 0x5f) * -0x2aaaaaab) >> 0x20);
        uVar6 = ((iVar2 >> 4) - (iVar2 >> 0x1f)) + iVar1;
      }
    }
    else {
      uVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    }
    V_DrawBorder(0,y1,uVar5 + 1,(screen->super_DSimpleCanvas).super_DCanvas.Height);
    V_DrawBorder(uVar6 - 1,y1,(screen->super_DSimpleCanvas).super_DCanvas.Width,
                 (screen->super_DSimpleCanvas).super_DCanvas.Height);
    if (9 < setblocks) {
      pFVar7 = (FTexture *)0x0;
      FVar3 = FTextureManager::GetTexture(&TexMan,gameinfo.Border.b.Chars,8,0);
      if (-1 < FVar3.texnum) {
        pFVar7 = TexMan.Textures.Array[(uint)FVar3.texnum].Texture;
      }
      if (pFVar7 != (FTexture *)0x0) {
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                  (screen,0,(ulong)y1,(ulong)uVar5,(ulong)(pFVar7->Height + y1),pFVar7,1);
        (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                  (screen,(ulong)uVar6,(ulong)y1,
                   (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
                   (ulong)(pFVar7->Height + y1),pFVar7,1);
      }
    }
  }
  return;
}

Assistant:

void DBaseStatusBar::RefreshBackground () const
{
	int x, x2, y;

	float ratio = ActiveRatio (SCREENWIDTH, SCREENHEIGHT);
	x = (ratio < 1.5f || !Scaled) ? ST_X : SCREENWIDTH*(48-AspectMultiplier(ratio))/(48*2);
	y = x == ST_X && x > 0 ? ST_Y : ::ST_Y;

	if(!CompleteBorder)
	{
		if(y < SCREENHEIGHT)
		{
			V_DrawBorder (x+1, y, SCREENWIDTH, y+1);
			V_DrawBorder (x+1, SCREENHEIGHT-1, SCREENWIDTH, SCREENHEIGHT);
		}
	}
	else
	{
		x = SCREENWIDTH;
	}

	if (x > 0)
	{
		if(!CompleteBorder)
		{
			x2 = ratio < 1.5f || !Scaled ? ST_X+HorizontalResolution :
				SCREENWIDTH - (SCREENWIDTH*(48-AspectMultiplier(ratio))+48*2-1)/(48*2);
		}
		else
		{
			x2 = SCREENWIDTH;
		}

		V_DrawBorder (0, y, x+1, SCREENHEIGHT);
		V_DrawBorder (x2-1, y, SCREENWIDTH, SCREENHEIGHT);

		if (setblocks >= 10)
		{
			FTexture *p = TexMan[gameinfo.Border.b];
			if (p != NULL)
			{
				screen->FlatFill(0, y, x, y + p->GetHeight(), p, true);
				screen->FlatFill(x2, y, SCREENWIDTH, y + p->GetHeight(), p, true);
			}
		}
	}
}